

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::
emplace_back_impl<QOpenGLFramebufferObjectPrivate::ColorAttachment>
          (QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *this,qsizetype prealloc,
          void *array,ColorAttachment *args)

{
  QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *this_00;
  QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *pQVar1;
  iterator ptr;
  ColorAttachment *pCVar2;
  ColorAttachment *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *)QVLABaseBase::size(in_RDI)
  ;
  pQVar1 = (QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *)
           QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *)this_01,in_RSI,in_RDX,
           (qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pCVar2 = q20::
           construct_at<QOpenGLFramebufferObjectPrivate::ColorAttachment,QOpenGLFramebufferObjectPrivate::ColorAttachment,void>
                     (ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pCVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }